

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

bool DnsStats::IsIpv4Name(uint8_t *name,size_t name_length)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  bool bVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  bool bVar9;
  
  bVar2 = false;
  if (name_length != 0) {
    bVar1 = true;
    iVar3 = 0;
    do {
      if (bVar1) {
        bVar7 = name[name_length - 1];
        name_length = name_length - 1;
        if ((byte)(bVar7 - 0x30) < 10) {
          iVar5 = 0;
          iVar8 = 1;
          do {
            iVar6 = (bVar7 - 0x30) * iVar8;
            if (999 < iVar8) {
              iVar6 = 0;
              bVar1 = bVar2;
            }
            iVar5 = iVar6 + iVar5;
            if ((name_length == 0) || (bVar1 == false)) break;
            iVar6 = iVar8 * 10;
            if (999 < iVar8) {
              iVar6 = iVar8;
            }
            iVar8 = iVar6;
            bVar7 = name[name_length - 1];
            name_length = name_length - 1;
          } while ((byte)(bVar7 - 0x30) < 10);
          bVar4 = iVar5 < 0x100;
        }
        else {
          bVar4 = true;
        }
        bVar9 = bVar7 == 0x2e;
      }
      else {
        bVar9 = false;
        bVar4 = true;
      }
      if (bVar1 != false) {
        bVar7 = (name_length == 0 | bVar9) & bVar4;
        iVar3 = iVar3 + (uint)bVar7;
        if (bVar7 == 0) {
          bVar1 = bVar2;
        }
      }
    } while (((name_length != 0) && (bVar1 != false)) && (iVar3 < 4));
    bVar2 = (bool)(iVar3 == 4 & bVar1);
  }
  return bVar2;
}

Assistant:

bool DnsStats::IsIpv4Name(const uint8_t * name, size_t name_length)
{
    int nb_num_dot = 0;
    size_t i;
    bool is_ipv4 = true;

    i = name_length;
    while (i > 0 && is_ipv4 && nb_num_dot < 4) {
        int mult = 1;
        int r = 0;
        int c = 0;

        while (is_ipv4 && i > 0) {
            i--;
            c = name[i];
            if (c >= '0' && c <= '9') {
                if (mult < 1000) {
                    r += mult * (c - '0');
                    mult *= 10;
                }
                else {
                    is_ipv4 = false;
                }
            }
            else {
                break;
            }
        }

        if (is_ipv4) {
            if ((i == 0 || c == '.') && r < 256) {
                nb_num_dot++;
            }
            else {
                is_ipv4 = false;
            }
        }
    }

    is_ipv4 &= (nb_num_dot == 4);

    return is_ipv4;
}